

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IncompleteCubeFormatCase::createTexture(IncompleteCubeFormatCase *this)

{
  uint uVar1;
  uint uVar2;
  int width;
  GLenum GVar3;
  uint uVar4;
  GLenum *pGVar5;
  int height;
  int iVar6;
  int targetNdx;
  ulong uVar7;
  int level;
  deUint32 format;
  GLuint texture;
  IncompleteCubeFormatCase *local_a8;
  TextureLevel levelData;
  Vec4 local_78;
  TextureFormat fmt;
  PixelBufferAccess local_58;
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0x8513,texture);
  glwTexParameteri(0x8513,0x2802,0x2901);
  glwTexParameteri(0x8513,0x2803,0x2901);
  glwTexParameteri(0x8513,0x2801,0x2700);
  glwTexParameteri(0x8513,0x2800,0x2600);
  uVar1 = (this->m_size).m_data[0];
  uVar2 = 0x20;
  uVar4 = uVar2;
  if (uVar1 != 0) {
    uVar4 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  uVar1 = (this->m_size).m_data[1];
  if (uVar1 != 0) {
    uVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  iVar6 = 0x1f - uVar2;
  if ((int)(0x1f - uVar2) < (int)(0x1f - uVar4)) {
    iVar6 = 0x1f - uVar4;
  }
  level = 0;
  local_a8 = this;
  while( true ) {
    if (level == iVar6 + 1) break;
    tcu::TextureLevel::setSize(&levelData,(this->m_size).m_data[0],(this->m_size).m_data[1],1);
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    local_78.m_data[0] = 0.0;
    local_78.m_data[1] = 0.0;
    local_78.m_data[2] = 1.0;
    local_78.m_data[3] = 1.0;
    tcu::clear(&local_58,&local_78);
    width = (this->m_size).m_data[0] >> ((byte)level & 0x1f);
    if (width < 2) {
      width = 1;
    }
    height = (this->m_size).m_data[1] >> ((byte)level & 0x1f);
    if (height < 2) {
      height = 1;
    }
    pGVar5 = &s_cubeTargets;
    for (uVar7 = 0; uVar7 != 6; uVar7 = uVar7 + 1) {
      format = *(deUint32 *)&(this->super_TexCubeCompletenessCase).field_0x84;
      if (level == 0) {
        if (uVar7 == this->m_invalidCubeFace) {
          format = this->m_invalidFormat;
        }
        if ((ulong)this->m_invalidCubeFace == 6) {
          format = this->m_invalidFormat;
        }
      }
      GVar3 = *pGVar5;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      glwTexImage2D(GVar3,level,format,width,height,0,format,0x1401,
                    local_58.super_ConstPixelBufferAccess.m_data);
      pGVar5 = pGVar5 + 1;
      this = local_a8;
    }
    level = level + 1;
  }
  GVar3 = glwGetError();
  glu::checkError(GVar3,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x2c2);
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void IncompleteCubeFormatCase::createTexture (void)
{
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_CUBE_MAP, texture);

	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri	(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		int	levelW = de::max(1, m_size.x() >> levelNdx);
		int	levelH = de::max(1, m_size.y() >> levelNdx);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
		{
			deUint32 format = m_format;
			if (levelNdx == 0 && (m_invalidCubeFace == tcu::CUBEFACE_LAST || m_invalidCubeFace == targetNdx))
				format = m_invalidFormat;

			glTexImage2D(s_cubeTargets[targetNdx], levelNdx, format, levelW, levelH, 0, format, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
		}
	}

	GLU_CHECK_MSG("Set texturing state");
}